

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_dialer_start(nng_dialer did,int flags)

{
  int iVar1;
  nni_dialer *pnStack_20;
  int rv;
  nni_dialer *d;
  uint32_t local_10;
  int flags_local;
  nng_dialer did_local;
  
  d._4_4_ = flags;
  local_10 = did.id;
  flags_local = nni_dialer_find(&stack0xffffffffffffffe0,did.id);
  if (flags_local == 0) {
    iVar1 = nni_dialer_start(pnStack_20,d._4_4_);
    nni_dialer_rele(pnStack_20);
    flags_local = iVar1;
  }
  return flags_local;
}

Assistant:

int
nng_dialer_start(nng_dialer did, int flags)
{
	nni_dialer *d;
	int         rv;

	if ((rv = nni_dialer_find(&d, did.id)) != 0) {
		return (rv);
	}
	rv = nni_dialer_start(d, flags);
	nni_dialer_rele(d);
	return (rv);
}